

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

shared_ptr<Item> __thiscall Player::GetMainHand(Player *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<Item> sVar1;
  Player *this_local;
  
  std::shared_ptr<Item>::shared_ptr((shared_ptr<Item> *)this,(shared_ptr<Item> *)(in_RSI + 0x2e0));
  sVar1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Item>)sVar1.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Item> Player::GetMainHand() {
    return m_main_hand_item;
}